

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.cpp
# Opt level: O2

void __thiscall Assimp::TextureTransformStep::Execute(TextureTransformStep *this,aiScene *pScene)

{
  STransformVecInfo *this_00;
  aiMaterial *paVar1;
  aiMaterialProperty *paVar2;
  aiMesh *paVar3;
  aiVector3D *__src;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint n_1;
  int iVar8;
  uint uVar9;
  undefined4 uVar10;
  Logger *pLVar11;
  long lVar12;
  _List_node_base *p_Var13;
  _List_node_base *p_Var14;
  aiVector3D *paVar15;
  uint uVar16;
  char *pcVar17;
  _List_node_base *p_Var18;
  uint n;
  ulong uVar19;
  aiMaterialProperty *this_01;
  aiMaterialProperty *__s1;
  aiMaterialProperty *this_02;
  _List_node_base *p_Var20;
  char *pcVar21;
  uint uVar22;
  _List_node_base *p_Var23;
  const_iterator __position;
  ulong uVar24;
  const_iterator __position_00;
  ulong uVar25;
  ulong uVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  aiVector3t<float> aVar32;
  int local_768;
  uint local_764;
  undefined1 local_748 [16];
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float local_728;
  float local_71c;
  bool ref [8];
  vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
  meshLists;
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [16];
  float local_6d8;
  aiMatrix3x3t<float> temp;
  aiMatrix3x3t<float> temp_1;
  aiMatrix3x3t<float> temp_2;
  aiMatrix3x3t<float> temp_3;
  aiMatrix3x3t<float> local_608;
  aiMatrix3x3t<float> local_5dc;
  aiVector3D *old [8];
  char buffer [1024];
  undefined8 extraout_XMM0_Qb;
  
  pLVar11 = DefaultLogger::get();
  Logger::debug(pLVar11,"TransformUVCoordsProcess begin");
  std::
  vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
  ::vector(&meshLists,(ulong)pScene->mNumMeshes,(allocator_type *)buffer);
  for (uVar24 = 0; uVar24 < pScene->mNumMaterials; uVar24 = uVar24 + 1) {
    paVar1 = pScene->mMaterials[uVar24];
    for (uVar26 = 0; uVar26 < paVar1->mNumProperties; uVar26 = uVar26 + 1) {
      paVar2 = paVar1->mProperties[uVar26];
      this_01 = (aiMaterialProperty *)(paVar2->mKey).data;
      iVar8 = strcmp((char *)this_01,"$tex.file");
      if (iVar8 == 0) {
        buffer[0] = '\0';
        buffer[1] = '\0';
        buffer[2] = '\0';
        buffer[3] = '\0';
        buffer[4] = '\0';
        buffer[5] = '\0';
        buffer[6] = '\0';
        buffer[7] = '\0';
        buffer[8] = '\0';
        buffer[9] = '\0';
        buffer[10] = -0x80;
        buffer[0xb] = '?';
        buffer[0xc] = '\0';
        buffer[0xd] = '\0';
        buffer[0xe] = -0x80;
        buffer[0xf] = '?';
        buffer[0x10] = '\0';
        buffer[0x11] = '\0';
        buffer[0x12] = '\0';
        buffer[0x13] = '\0';
        buffer[0x14] = '\0';
        buffer[0x15] = '\0';
        buffer[0x16] = '\0';
        buffer[0x17] = '\0';
        buffer[0x18] = '\0';
        buffer[0x19] = '\0';
        buffer[0x1a] = '\0';
        buffer[0x1b] = '\0';
        buffer[0x1c] = '\0';
        buffer[0x1d] = '\0';
        buffer[0x1e] = '\0';
        buffer[0x1f] = '\0';
        buffer[0x20] = -0x12;
        buffer[0x21] = -0x12;
        buffer[0x22] = -0x12;
        buffer[0x23] = -0x12;
        buffer._40_8_ = buffer + 0x28;
        buffer[0x38] = '\0';
        buffer[0x39] = '\0';
        buffer[0x3a] = '\0';
        buffer[0x3b] = '\0';
        buffer[0x3c] = '\0';
        buffer[0x3d] = '\0';
        buffer[0x3e] = '\0';
        buffer[0x3f] = '\0';
        old[0] = (aiVector3D *)0x0;
        old[2] = *(aiVector3D **)&paVar2->mSemantic;
        uVar25 = 0;
        old[1] = (aiVector3D *)paVar1;
        buffer._48_8_ = buffer._40_8_;
        while (uVar22 = (uint)uVar25, uVar22 < paVar1->mNumProperties) {
          this_02 = paVar1->mProperties[uVar25];
          if ((this_02->mSemantic == paVar2->mSemantic) && (this_02->mIndex == paVar2->mIndex)) {
            __s1 = (aiMaterialProperty *)(this_02->mKey).data;
            this_01 = __s1;
            iVar8 = strcmp((char *)__s1,"$tex.uvwsrc");
            if (iVar8 == 0) {
              old[0] = (aiVector3D *)this_02->mData;
              buffer._20_4_ = old[0]->x;
            }
            else {
              this_01 = __s1;
              iVar8 = strcmp((char *)__s1,"$tex.mapmodeu");
              if (iVar8 == 0) {
                buffer._24_4_ = *(undefined4 *)this_02->mData;
              }
              else {
                this_01 = __s1;
                iVar8 = strcmp((char *)__s1,"$tex.mapmodev");
                if (iVar8 == 0) {
                  buffer._28_4_ = *(undefined4 *)this_02->mData;
                }
                else {
                  iVar8 = strcmp((char *)__s1,"$tex.uvtrafo");
                  this_01 = __s1;
                  if (iVar8 == 0) {
                    if (this_02->mDataLength < 0x14) {
                      __assert_fail("prop2->mDataLength >= 20",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/TextureTransform.cpp"
                                    ,0x10f,
                                    "virtual void Assimp::TextureTransformStep::Execute(aiScene *)")
                      ;
                    }
                    pcVar21 = this_02->mData;
                    buffer._16_4_ = *(undefined4 *)(pcVar21 + 0x10);
                    buffer._0_8_ = *(undefined8 *)pcVar21;
                    buffer._8_8_ = *(undefined8 *)(pcVar21 + 8);
                    uVar9 = paVar1->mNumProperties - 1;
                    paVar1->mNumProperties = uVar9;
                    for (; uVar25 < uVar9; uVar25 = uVar25 + 1) {
                      paVar1->mProperties[uVar25] = paVar1->mProperties[uVar25 + 1];
                      uVar9 = paVar1->mNumProperties;
                    }
                    if (this_02 != (aiMaterialProperty *)0x0) {
                      aiMaterialProperty::~aiMaterialProperty(this_02);
                    }
                    operator_delete(this_02,0x420);
                    uVar22 = uVar22 - 1;
                    this_01 = this_02;
                  }
                }
              }
            }
          }
          uVar25 = (ulong)(uVar22 + 1);
        }
        uVar22 = this->configFlags;
        if ((uVar22 & 2) == 0) {
          buffer._16_8_ = buffer._16_8_ & 0xffffffff00000000;
        }
        if ((uVar22 & 1) == 0) {
          buffer[8] = '\0';
          buffer[9] = '\0';
          buffer[10] = -0x80;
          buffer[0xb] = '?';
          buffer[0xc] = '\0';
          buffer[0xd] = '\0';
          buffer[0xe] = -0x80;
          buffer[0xf] = '?';
        }
        if ((uVar22 & 4) == 0) {
          buffer[0] = '\0';
          buffer[1] = '\0';
          buffer[2] = '\0';
          buffer[3] = '\0';
          buffer[4] = '\0';
          buffer[5] = '\0';
          buffer[6] = '\0';
          buffer[7] = '\0';
        }
        PreProcessUVTransform((TextureTransformStep *)this_01,(STransformVecInfo *)buffer);
        uVar10 = buffer._20_4_;
        if (6 < (uint)buffer._20_4_) {
          uVar10._0_1_ = '\a';
          uVar10._1_1_ = '\0';
          uVar10._2_1_ = '\0';
          uVar10._3_1_ = '\0';
        }
        buffer[0x14] = (char)uVar10;
        buffer[0x15] = SUB41(uVar10,1);
        buffer[0x16] = SUB41(uVar10,2);
        buffer[0x17] = SUB41(uVar10,3);
        uVar25 = (ulong)pScene->mNumMeshes;
        iVar8 = 0;
        for (uVar19 = 0; uVar25 != uVar19; uVar19 = uVar19 + 1) {
          iVar8 = iVar8 + (uint)(uVar24 == pScene->mMeshes[uVar19]->mMaterialIndex);
        }
        if (iVar8 != 0) {
          if (iVar8 != 1) {
            buffer[0x20] = -1;
            buffer[0x21] = -1;
            buffer[0x22] = -1;
            buffer[0x23] = -1;
          }
          for (uVar19 = 0; uVar19 < uVar25; uVar19 = uVar19 + 1) {
            paVar3 = pScene->mMeshes[uVar19];
            if ((uVar24 == paVar3->mMaterialIndex) &&
               (paVar3->mTextureCoords[0] != (aiVector3D *)0x0)) {
              iVar8 = buffer._20_4_;
              if (paVar3->mTextureCoords[(uint)buffer._20_4_] == (aiVector3D *)0x0) {
                iVar8 = 0;
              }
              if (paVar3->mNumUVComponents[(uint)buffer._20_4_] < 3) {
                p_Var23 = (_List_node_base *)
                          (meshLists.
                           super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar19);
                do {
                  p_Var23 = (((_List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                               *)&p_Var23->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                  if (p_Var23 ==
                      (_List_node_base *)
                      (meshLists.
                       super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar19)) goto LAB_003bbf59;
                  bVar5 = STransformVecInfo::operator==
                                    ((STransformVecInfo *)(p_Var23 + 1),(STransformVecInfo *)buffer)
                  ;
                } while ((!bVar5) || (*(int *)((long)&p_Var23[2]._M_next + 4) != iVar8));
                std::__cxx11::list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>::
                push_back((list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                          &p_Var23[3]._M_prev,(value_type *)old);
LAB_003bbf59:
                if (p_Var23 ==
                    (_List_node_base *)
                    (meshLists.
                     super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar19)) {
                  std::__cxx11::
                  list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::
                  push_back(meshLists.
                            super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar19,(value_type *)buffer)
                  ;
                  *(int *)((long)&meshLists.
                                  super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar19].
                                  super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                                  ._M_impl._M_node.super__List_node_base._M_prev[2]._M_next + 4) =
                       iVar8;
                  std::__cxx11::list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>::
                  push_back((list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                            &meshLists.
                             super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar19].
                             super__List_base<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>
                             ._M_impl._M_node.super__List_node_base._M_prev[3]._M_prev,
                            (value_type *)old);
                }
              }
              else {
                pLVar11 = DefaultLogger::get();
                Logger::warn(pLVar11,"UV transformations on 3D mapping channels are not supported");
              }
            }
            uVar25 = (ulong)pScene->mNumMeshes;
          }
        }
        std::__cxx11::_List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>::
        _M_clear((_List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                 (buffer + 0x28));
      }
    }
  }
  uVar24 = 0;
  local_768 = 0;
LAB_003bbfda:
  if (pScene->mNumMeshes <= uVar24) {
    bVar5 = DefaultLogger::isNullLogger();
    if (!bVar5) {
      if (local_768 == 0) {
        pLVar11 = DefaultLogger::get();
        Logger::debug(pLVar11,"TransformUVCoordsProcess finished");
      }
      else {
        pLVar11 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[31]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)old,
                   (char (*) [31])"TransformUVCoordsProcess end: ");
        std::ostream::_M_insert<unsigned_long>((ulong)old);
        std::operator<<((ostream *)old," output channels (in: ");
        std::ostream::_M_insert<unsigned_long>((ulong)old);
        std::operator<<((ostream *)old,", modified: ");
        std::ostream::_M_insert<unsigned_long>((ulong)old);
        std::operator<<((ostream *)old,")");
        std::__cxx11::stringbuf::str();
        Logger::info(pLVar11,(char *)local_748._0_8_);
        std::__cxx11::string::~string((string *)local_748);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)old);
      }
    }
    std::
    vector<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
    ::~vector(&meshLists);
    return;
  }
  paVar3 = pScene->mMeshes[uVar24];
  p_Var23 = (_List_node_base *)
            (meshLists.
             super__Vector_base<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>,_std::allocator<std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar24);
  aiMesh::GetNumUVChannels(paVar3);
  if (((paVar3->mTextureCoords[0] != (aiVector3D *)0x0) && (p_Var23->_M_next != p_Var23)) &&
     ((p_Var23[1]._M_next != (_List_node_base *)0x1 ||
      (bVar5 = STransformVecInfo::IsUntransformed((STransformVecInfo *)(p_Var23->_M_next + 1)),
      !bVar5)))) {
    iVar8 = 0;
    bVar7 = false;
    __position_00._M_node = p_Var23;
    bVar5 = false;
    while (__position_00._M_node = (__position_00._M_node)->_M_next,
          __position_00._M_node != p_Var23) {
      this_00 = (STransformVecInfo *)(__position_00._M_node + 1);
      bVar6 = STransformVecInfo::IsUntransformed(this_00);
      if (*(int *)&__position_00._M_node[3]._M_next == -1) {
        *(int *)&__position_00._M_node[3]._M_next = iVar8;
        bVar7 = true;
      }
      else {
        bVar4 = !bVar7;
        bVar7 = true;
        if (bVar4) {
          if ((__position_00._M_node != p_Var23->_M_next) &&
             (bVar7 = STransformVecInfo::IsUntransformed(this_00), __position._M_node = p_Var23,
             bVar7)) goto LAB_003bc755;
          bVar7 = false;
        }
      }
      iVar8 = iVar8 + 1;
      bVar5 = (bool)(!bVar6 | bVar5);
    }
    if (!bVar5) goto LAB_003bc742;
    goto LAB_003bc0d6;
  }
  aiMesh::GetNumUVChannels(paVar3);
  goto LAB_003bc742;
  while (bVar7 = STransformVecInfo::IsUntransformed((STransformVecInfo *)(__position._M_node + 1)),
        bVar7) {
LAB_003bc755:
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == __position_00._M_node) break;
  }
  std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::insert
            ((list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_> *)p_Var23,
             __position,this_00);
  std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::erase
            ((list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_> *)p_Var23,
             __position_00);
  if (!bVar6 || bVar5) {
LAB_003bc0d6:
    local_764 = 0;
    uVar22 = 0;
    paVar15 = (aiVector3D *)(old + 5);
    p_Var13 = p_Var23;
    while (p_Var13 = p_Var13->_M_next, p_Var13 != p_Var23) {
      uVar9 = *(uint *)&p_Var13[3]._M_next;
      if (uVar9 != uVar22 && uVar9 != 0xeeeeeeee) {
        p_Var20 = p_Var23;
        do {
          p_Var20 = p_Var20->_M_next;
        } while (uVar9 != 0);
        if (*(int *)&p_Var20[3]._M_next == -0x11111112) {
          std::swap<Assimp::STransformVecInfo>
                    ((STransformVecInfo *)(p_Var20 + 1),(STransformVecInfo *)(p_Var13 + 1));
          if (*(uint *)&p_Var13[3]._M_next == local_764) {
            local_764 = uVar22;
          }
        }
        else {
          pLVar11 = DefaultLogger::get();
          Logger::error(pLVar11,
                        "Channel mismatch, can\'t compute all transformations properly [design bug]"
                       );
        }
      }
      uVar22 = uVar22 + 1;
    }
    for (lVar12 = 0; p_Var13 = p_Var23, lVar12 != 8; lVar12 = lVar12 + 1) {
      ref[lVar12] = paVar3->mTextureCoords[lVar12] == (aiVector3D *)0x0;
    }
    while (p_Var13 = p_Var13->_M_next, p_Var13 != p_Var23) {
      ref[*(uint *)((long)&p_Var13[2]._M_next + 4)] = true;
    }
    for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
      if (ref[lVar12] == false) {
        old[0] = (aiVector3D *)0x0;
        old[1] = (aiVector3D *)0x3f8000003f800000;
        old[2] = (aiVector3D *)0x0;
        old[3] = (aiVector3D *)0x0;
        old[4]._0_4_ = 0xeeeeeeee;
        old[7] = (aiVector3D *)0x0;
        old[5] = paVar15;
        old[6] = paVar15;
        std::__cxx11::list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_>::
        push_back((list<Assimp::STransformVecInfo,_std::allocator<Assimp::STransformVecInfo>_> *)
                  p_Var23,(value_type *)old);
        std::__cxx11::_List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>::
        _M_clear((_List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)paVar15)
        ;
        *(int *)((long)&p_Var23->_M_prev[2]._M_next + 4) = (int)lVar12;
      }
    }
    uVar22 = *(uint *)&p_Var23[1]._M_next;
    if (8 < uVar22) {
      bVar5 = DefaultLogger::isNullLogger();
      uVar22 = 8;
      if (!bVar5) {
        pLVar11 = DefaultLogger::get();
        local_608.a1 = *(float *)&p_Var23[1]._M_next;
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<unsigned_int>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)old,
                   (uint *)&local_608);
        std::operator<<((ostream *)old," UV channels required but just ");
        std::ostream::operator<<((value_type *)old,8);
        std::operator<<((ostream *)old," available");
        std::__cxx11::stringbuf::str();
        Logger::error(pLVar11,(char *)local_748._0_8_);
        std::__cxx11::string::~string((string *)local_748);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)old);
        uVar22 = 8;
      }
    }
    for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
      old[lVar12] = paVar3->mTextureCoords[lVar12];
    }
    p_Var20 = (_List_node_base *)0x0;
    p_Var13 = p_Var23;
    while (uVar9 = (uint)p_Var20, p_Var20 < p_Var23[1]._M_next) {
      p_Var13 = p_Var13->_M_next;
      if (uVar9 < uVar22) {
        bVar5 = DefaultLogger::isNullLogger();
        if (!bVar5) {
          pcVar21 = "-c";
          if (*(int *)&p_Var13[2]._M_prev == 2) {
            pcVar21 = "-m";
          }
          if (*(int *)&p_Var13[2]._M_prev == 0) {
            pcVar21 = "-w";
          }
          iVar8 = *(int *)((long)&p_Var13[2]._M_prev + 4);
          pcVar17 = "-c";
          if (iVar8 == 2) {
            pcVar17 = "-m";
          }
          if (iVar8 == 0) {
            pcVar17 = "-w";
          }
          snprintf(buffer,0x400,"Mesh %u, channel %u: t(%.3f,%.3f), s(%.3f,%.3f), r(%.3f), %s%s",
                   (double)*(float *)&p_Var13[1]._M_next,
                   SUB84((double)*(float *)((long)&p_Var13[1]._M_next + 4),0),
                   (double)*(float *)&p_Var13[1]._M_prev,
                   (double)*(float *)((long)&p_Var13[1]._M_prev + 4),
                   (double)(*(float *)&p_Var13[2]._M_next * 57.29578),uVar24,p_Var20,pcVar21,pcVar17
                  );
          pLVar11 = DefaultLogger::get();
          Logger::info(pLVar11,buffer);
        }
        paVar15 = paVar3->mTextureCoords[(long)p_Var20];
        p_Var14 = p_Var13;
        p_Var18 = p_Var20;
        if (paVar15 == (aiVector3D *)0x0) {
          uVar16 = paVar3->mNumVertices;
          uVar26 = (ulong)uVar16 * 0xc;
          paVar15 = (aiVector3D *)operator_new__(uVar26);
        }
        else {
          do {
            p_Var14 = p_Var14->_M_next;
            uVar16 = (int)p_Var18 + 1;
            if (uVar22 <= uVar16) {
              if (p_Var14 != p_Var23->_M_next) goto LAB_003bc449;
              break;
            }
            p_Var18 = (_List_node_base *)(ulong)uVar16;
          } while (*(uint *)((long)&p_Var14[2]._M_next + 4) != uVar9);
          uVar16 = paVar3->mNumVertices;
          uVar26 = (ulong)uVar16 * 0xc;
          paVar15 = (aiVector3D *)operator_new__(uVar26);
        }
        if (uVar16 != 0) {
          memset(paVar15,0,((uVar26 - 0xc) - (uVar26 - 0xc) % 0xc) + 0xc);
        }
        paVar3->mTextureCoords[(long)p_Var20] = paVar15;
LAB_003bc449:
        __src = old[*(uint *)((long)&p_Var13[2]._M_next + 4)];
        if (__src == (aiVector3D *)0x0) {
          __assert_fail("__null != src",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/TextureTransform.cpp"
                        ,0x1fe,"virtual void Assimp::TextureTransformStep::Execute(aiScene *)");
        }
        if (paVar15 != __src) {
          memcpy(paVar15,__src,(ulong)paVar3->mNumVertices * 0xc);
        }
        uVar16 = paVar3->mNumVertices;
        bVar5 = STransformVecInfo::IsUntransformed((STransformVecInfo *)(p_Var13 + 1));
        if (!bVar5) {
          local_748._0_12_ = ZEXT812(0x3f800000);
          local_748._12_4_ = 0;
          local_738 = local_748._0_4_;
          fStack_734 = 0.0;
          fStack_730 = 0.0;
          fStack_72c = 0.0;
          local_5dc.a2 = 0.0;
          local_5dc.a3 = 0.0;
          local_728 = 1.0;
          local_5dc.b1 = 0.0;
          local_608.c3 = 1.0;
          local_5dc.b3 = 0.0;
          local_5dc.c1 = 0.0;
          local_5dc.c2 = 0.0;
          local_5dc.c3 = 1.0;
          local_6d8 = 1.0;
          local_608.b2 = 1.0;
          local_608.b3 = -0.5;
          local_608.c1 = 0.0;
          local_608.c2 = 0.0;
          local_5dc.a1 = *(float *)&p_Var13[1]._M_prev;
          local_5dc.b2 = *(float *)((long)&p_Var13[1]._M_prev + 4);
          local_608.a1 = 1.0;
          local_608.a2 = 0.0;
          local_608.a3 = -0.5;
          local_608.b1 = 0.0;
          fVar27 = *(float *)&p_Var13[2]._M_next;
          fVar30 = 0.0;
          fVar31 = 0.0;
          local_6f8 = local_748;
          local_6e8 = local_748;
          if (0.008726646 < fVar27) {
            local_71c = fVar27;
            local_738 = cosf(fVar27);
            local_748._0_4_ = local_738;
            fVar27 = sinf(local_71c);
            local_748._0_8_ = CONCAT44(fVar27,local_748._0_4_) ^ 0x8000000000000000;
            local_748._8_4_ = 0;
            local_748._12_4_ = fVar27;
            fVar30 = (float)local_6f8._8_4_;
            fVar31 = (float)local_6e8._4_4_;
          }
          fStack_734 = 0.0;
          local_728 = 1.0;
          fStack_72c = 0.0;
          fStack_730 = 0.0;
          local_6f8._8_4_ = fVar30 + *(float *)&p_Var13[1]._M_next;
          local_6e8._4_4_ = fVar31 + *(float *)((long)&p_Var13[1]._M_next + 4);
          temp.a1 = 1.0;
          temp.a2 = 0.0;
          temp.a3 = 0.5;
          temp.b1 = 0.0;
          temp.b2 = 1.0;
          temp.b3 = 0.5;
          temp.c1 = 0.0;
          temp.c2 = 0.0;
          temp.c3 = 1.0;
          aiMatrix3x3t<float>::operator*=(&temp,&local_5dc);
          temp_1.c3 = temp.c3;
          temp_1.b2 = temp.b2;
          temp_1.b3 = temp.b3;
          temp_1.c1 = temp.c1;
          temp_1.c2 = temp.c2;
          temp_1.a1 = temp.a1;
          temp_1.a2 = temp.a2;
          temp_1.a3 = temp.a3;
          temp_1.b1 = temp.b1;
          aiMatrix3x3t<float>::operator*=(&temp_1,(aiMatrix3x3t<float> *)local_748);
          temp_2.c3 = temp_1.c3;
          temp_2.b2 = temp_1.b2;
          temp_2.b3 = temp_1.b3;
          temp_2.c1 = temp_1.c1;
          temp_2.c2 = temp_1.c2;
          temp_2.a1 = temp_1.a1;
          temp_2.a2 = temp_1.a2;
          temp_2.a3 = temp_1.a3;
          temp_2.b1 = temp_1.b1;
          aiMatrix3x3t<float>::operator*=(&temp_2,&local_608);
          temp_3.c3 = temp_2.c3;
          temp_3.b2 = temp_2.b2;
          temp_3.b3 = temp_2.b3;
          temp_3.c1 = temp_2.c1;
          temp_3.c2 = temp_2.c2;
          temp_3.a1 = temp_2.a1;
          temp_3.a2 = temp_2.a2;
          temp_3.a3 = temp_2.a3;
          temp_3.b1 = temp_2.b1;
          aiMatrix3x3t<float>::operator*=(&temp_3,(aiMatrix3x3t<float> *)local_6f8);
          local_768 = local_768 + 1;
          local_728 = temp_3.c3;
          local_738 = temp_3.b2;
          fStack_734 = temp_3.b3;
          fStack_730 = temp_3.c1;
          fStack_72c = temp_3.c2;
          local_748._8_4_ = temp_3.a3;
          local_748._12_4_ = temp_3.b1;
          local_748._0_4_ = temp_3.a1;
          local_748._4_4_ = temp_3.a2;
          fVar27 = temp_3.b3;
          for (lVar12 = (ulong)uVar16 * 0xc; lVar12 != 0; lVar12 = lVar12 + -0xc) {
            paVar15->z = 1.0;
            aVar32 = ::operator*((aiMatrix3x3t<float> *)local_748,paVar15);
            fVar30 = aVar32.z;
            auVar28._0_8_ = aVar32._0_8_;
            auVar28._8_8_ = extraout_XMM0_Qb;
            auVar29._4_4_ = fVar30;
            auVar29._0_4_ = fVar30;
            auVar29._8_4_ = fVar27;
            auVar29._12_4_ = fVar27;
            auVar29 = divps(auVar28,auVar29);
            paVar15->x = (float)(int)auVar29._0_8_;
            paVar15->y = (float)(int)((ulong)auVar29._0_8_ >> 0x20);
            paVar15->z = 0.0;
            paVar15 = paVar15 + 1;
            fVar27 = fVar30;
          }
        }
        UpdateUVIndex((list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                      &p_Var13[3]._M_prev,uVar9);
      }
      else {
        UpdateUVIndex((list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *)
                      &p_Var13[3]._M_prev,local_764);
      }
      p_Var20 = (_List_node_base *)(ulong)(uVar9 + 1);
    }
  }
LAB_003bc742:
  uVar24 = uVar24 + 1;
  goto LAB_003bbfda;
}

Assistant:

void TextureTransformStep::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("TransformUVCoordsProcess begin");


    /*  We build a per-mesh list of texture transformations we'll need
     *  to apply. To achieve this, we iterate through all materials,
     *  find all textures and get their transformations and UV indices.
     *  Then we search for all meshes using this material.
     */
    typedef std::list<STransformVecInfo> MeshTrafoList;
    std::vector<MeshTrafoList> meshLists(pScene->mNumMeshes);

    for (unsigned int i = 0; i < pScene->mNumMaterials;++i) {

        aiMaterial* mat = pScene->mMaterials[i];
        for (unsigned int a = 0; a < mat->mNumProperties;++a)   {

            aiMaterialProperty* prop = mat->mProperties[a];
            if (!::strcmp( prop->mKey.data, "$tex.file"))   {
                STransformVecInfo info;

                // Setup a shortcut structure to allow for a fast updating
                // of the UV index later
                TTUpdateInfo update;
                update.mat = (aiMaterial*) mat;
                update.semantic = prop->mSemantic;
                update.index = prop->mIndex;

                // Get textured properties and transform
                for (unsigned int a2 = 0; a2 < mat->mNumProperties;++a2)  {
                    aiMaterialProperty* prop2 = mat->mProperties[a2];
                    if (prop2->mSemantic != prop->mSemantic || prop2->mIndex != prop->mIndex) {
                        continue;
                    }

                    if ( !::strcmp( prop2->mKey.data, "$tex.uvwsrc")) {
                        info.uvIndex = *((int*)prop2->mData);

                        // Store a direct pointer for later use
                        update.directShortcut = (unsigned int*) prop2->mData;
                    }

                    else if ( !::strcmp( prop2->mKey.data, "$tex.mapmodeu")) {
                        info.mapU = *((aiTextureMapMode*)prop2->mData);
                    }
                    else if ( !::strcmp( prop2->mKey.data, "$tex.mapmodev")) {
                        info.mapV = *((aiTextureMapMode*)prop2->mData);
                    }
                    else if ( !::strcmp( prop2->mKey.data, "$tex.uvtrafo"))  {
                        // ValidateDS should check this
                        ai_assert(prop2->mDataLength >= 20);
                        ::memcpy(&info.mTranslation.x,prop2->mData,sizeof(float)*5);

                        // Directly remove this property from the list
                        mat->mNumProperties--;
                        for (unsigned int a3 = a2; a3 < mat->mNumProperties;++a3) {
                            mat->mProperties[a3] = mat->mProperties[a3+1];
                        }

                        delete prop2;

                        // Warn: could be an underflow, but this does not invoke undefined behaviour
                        --a2;
                    }
                }

                // Find out which transformations are to be evaluated
                if (!(configFlags & AI_UVTRAFO_ROTATION)) {
                    info.mRotation = 0.f;
                }
                if (!(configFlags & AI_UVTRAFO_SCALING)) {
                    info.mScaling = aiVector2D(1.f,1.f);
                }
                if (!(configFlags & AI_UVTRAFO_TRANSLATION)) {
                    info.mTranslation = aiVector2D(0.f,0.f);
                }

                // Do some preprocessing
                PreProcessUVTransform(info);
                info.uvIndex = std::min(info.uvIndex,AI_MAX_NUMBER_OF_TEXTURECOORDS -1u);

                // Find out whether this material is used by more than
                // one mesh. This will make our task much, much more difficult!
                unsigned int cnt = 0;
                for (unsigned int n = 0; n < pScene->mNumMeshes;++n)    {
                    if (pScene->mMeshes[n]->mMaterialIndex == i)
                        ++cnt;
                }

                if (!cnt)
                    continue;
                else if (1 != cnt)  {
                    // This material is referenced by more than one mesh!
                    // So we need to make sure the UV index for the texture
                    // is identical for each of it ...
                    info.lockedPos = AI_TT_UV_IDX_LOCK_TBD;
                }

                // Get all corresponding meshes
                for (unsigned int n = 0; n < pScene->mNumMeshes;++n)    {
                    aiMesh* mesh = pScene->mMeshes[n];
                    if (mesh->mMaterialIndex != i || !mesh->mTextureCoords[0])
                        continue;

                    unsigned int uv = info.uvIndex;
                    if (!mesh->mTextureCoords[uv])  {
                        // If the requested UV index is not available, take the first one instead.
                        uv = 0;
                    }

                    if (mesh->mNumUVComponents[info.uvIndex] >= 3){
                        ASSIMP_LOG_WARN("UV transformations on 3D mapping channels are not supported");
                        continue;
                    }

                    MeshTrafoList::iterator it;

                    // Check whether we have this transform setup already
                    for (it = meshLists[n].begin();it != meshLists[n].end(); ++it)  {

                        if ((*it) == info && (*it).uvIndex == uv)   {
                            (*it).updateList.push_back(update);
                            break;
                        }
                    }

                    if (it == meshLists[n].end())   {
                        meshLists[n].push_back(info);
                        meshLists[n].back().uvIndex = uv;
                        meshLists[n].back().updateList.push_back(update);
                    }
                }
            }
        }
    }

    char buffer[1024]; // should be sufficiently large
    unsigned int outChannels = 0, inChannels = 0, transformedChannels = 0;

    // Now process all meshes. Important: we don't remove unreferenced UV channels.
    // This is a job for the RemoveUnreferencedData-Step.
    for (unsigned int q = 0; q < pScene->mNumMeshes;++q)    {

        aiMesh* mesh = pScene->mMeshes[q];
        MeshTrafoList& trafo =  meshLists[q];

        inChannels += mesh->GetNumUVChannels();

        if (!mesh->mTextureCoords[0] || trafo.empty() ||  (trafo.size() == 1 && trafo.begin()->IsUntransformed())) {
            outChannels += mesh->GetNumUVChannels();
            continue;
        }

        // Move untransformed UV channels to the first position in the list ....
        // except if we need a new locked index which should be as small as possible
        bool veto = false, need = false;
        unsigned int cnt = 0;
        unsigned int untransformed = 0;

        MeshTrafoList::iterator it,it2;
        for (it = trafo.begin();it != trafo.end(); ++it,++cnt)  {

            if (!(*it).IsUntransformed()) {
                need = true;
            }

            if ((*it).lockedPos == AI_TT_UV_IDX_LOCK_TBD)   {
                // Lock this index and make sure it won't be changed
                (*it).lockedPos = cnt;
                veto = true;
                continue;
            }

            if (!veto && it != trafo.begin() && (*it).IsUntransformed())    {
                for (it2 = trafo.begin();it2 != it; ++it2) {
                    if (!(*it2).IsUntransformed())
                        break;
                }
                trafo.insert(it2,*it);
                trafo.erase(it);
                break;
            }
        }
        if (!need)
            continue;

        // Find all that are not at their 'locked' position and move them to it.
        // Conflicts are possible but quite unlikely.
        cnt = 0;
        for (it = trafo.begin();it != trafo.end(); ++it,++cnt) {
            if ((*it).lockedPos != AI_TT_UV_IDX_LOCK_NONE && (*it).lockedPos != cnt) {
                it2 = trafo.begin();unsigned int t = 0;
                while (t != (*it).lockedPos)
                    ++it2;

                if ((*it2).lockedPos != AI_TT_UV_IDX_LOCK_NONE) {
                    ASSIMP_LOG_ERROR("Channel mismatch, can't compute all transformations properly [design bug]");
                    continue;
                }

                std::swap(*it2,*it);
                if ((*it).lockedPos == untransformed)
                    untransformed = cnt;
            }
        }

        // ... and add dummies for all unreferenced channels
        // at the end of the list
        bool ref[AI_MAX_NUMBER_OF_TEXTURECOORDS];
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n)
            ref[n] = (!mesh->mTextureCoords[n] ? true : false);

        for (it = trafo.begin();it != trafo.end(); ++it)
            ref[(*it).uvIndex] = true;

        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
            if (ref[n])
                continue;
            trafo.push_back(STransformVecInfo());
            trafo.back().uvIndex = n;
        }

        // Then check whether this list breaks the channel limit.
        // The unimportant ones are at the end of the list, so
        // it shouldn't be too worse if we remove them.
        unsigned int size = (unsigned int)trafo.size();
        if (size > AI_MAX_NUMBER_OF_TEXTURECOORDS) {

            if (!DefaultLogger::isNullLogger()) {
                ASSIMP_LOG_ERROR_F(static_cast<unsigned int>(trafo.size()), " UV channels required but just ", 
                    AI_MAX_NUMBER_OF_TEXTURECOORDS, " available");
            }
            size = AI_MAX_NUMBER_OF_TEXTURECOORDS;
        }


        aiVector3D* old[AI_MAX_NUMBER_OF_TEXTURECOORDS];
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n)
            old[n] = mesh->mTextureCoords[n];

        // Now continue and generate the output channels. Channels
        // that we're not going to need later can be overridden.
        it = trafo.begin();
        for (unsigned int n = 0; n < trafo.size();++n,++it) {

            if (n >= size)  {
                // Try to use an untransformed channel for all channels we threw over board
                UpdateUVIndex((*it).updateList,untransformed);
                continue;
            }

            outChannels++;

            // Write to the log
            if (!DefaultLogger::isNullLogger()) {
                ::ai_snprintf(buffer,1024,"Mesh %u, channel %u: t(%.3f,%.3f), s(%.3f,%.3f), r(%.3f), %s%s",
                    q,n,
                    (*it).mTranslation.x,
                    (*it).mTranslation.y,
                    (*it).mScaling.x,
                    (*it).mScaling.y,
                    AI_RAD_TO_DEG( (*it).mRotation),
                    MappingModeToChar ((*it).mapU),
                    MappingModeToChar ((*it).mapV));

                ASSIMP_LOG_INFO(buffer);
            }

            // Check whether we need a new buffer here
            if (mesh->mTextureCoords[n])    {

                it2 = it;++it2;
                for (unsigned int m = n+1; m < size;++m, ++it2) {

                    if ((*it2).uvIndex == n){
                        it2 = trafo.begin();
                        break;
                    }
                }
                if (it2 == trafo.begin()){
                    mesh->mTextureCoords[n] = new aiVector3D[mesh->mNumVertices];
                }
            }
            else mesh->mTextureCoords[n] = new aiVector3D[mesh->mNumVertices];

            aiVector3D* src = old[(*it).uvIndex];
            aiVector3D* dest, *end;
            dest = mesh->mTextureCoords[n];

            ai_assert(NULL != src);

            // Copy the data to the destination array
            if (dest != src)
                ::memcpy(dest,src,sizeof(aiVector3D)*mesh->mNumVertices);

            end = dest + mesh->mNumVertices;

            // Build a transformation matrix and transform all UV coords with it
            if (!(*it).IsUntransformed()) {
                const aiVector2D& trl = (*it).mTranslation;
                const aiVector2D& scl = (*it).mScaling;

                // fixme: simplify ..
                ++transformedChannels;
                aiMatrix3x3 matrix;

                aiMatrix3x3 m2,m3,m4,m5;

                m4.a1 = scl.x;
                m4.b2 = scl.y;

                m2.a3 = m2.b3 = 0.5f;
                m3.a3 = m3.b3 = -0.5f;

                if ((*it).mRotation > AI_TT_ROTATION_EPSILON )
                    aiMatrix3x3::RotationZ((*it).mRotation,matrix);

                m5.a3 += trl.x; m5.b3 += trl.y;
                matrix = m2 * m4 * matrix * m3 * m5;

                for (src = dest; src != end; ++src) { /* manual homogenious divide */
                    src->z = 1.f;
                    *src = matrix * *src;
                    src->x /= src->z;
                    src->y /= src->z;
                    src->z = 0.f;
                }
            }

            // Update all UV indices
            UpdateUVIndex((*it).updateList,n);
        }
    }

    // Print some detailed statistics into the log
    if (!DefaultLogger::isNullLogger()) {

        if (transformedChannels)    {
            ASSIMP_LOG_INFO_F("TransformUVCoordsProcess end: ", outChannels, " output channels (in: ", inChannels, ", modified: ", transformedChannels,")");
        } else {
            ASSIMP_LOG_DEBUG("TransformUVCoordsProcess finished");
        }
    }
}